

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send_message.cpp
# Opt level: O2

void pstore::brokerface::send_message(writer *wr,bool error_on_timeout,czstring verb,czstring path)

{
  undefined1 auVar1 [16];
  uint32_t mid;
  ushort nump;
  ulong __n;
  difference_type __d;
  pointer pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  ushort pno;
  string payload;
  message_type local_130;
  
  if (verb == (czstring)0x0) {
    assert_failed("verb != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/brokerface/send_message.cpp"
                  ,0x25);
  }
  std::__cxx11::string::string((string *)&payload,verb,(allocator *)&local_130);
  if ((path != (czstring)0x0) && (*path != '\0')) {
    std::__cxx11::string::append((char *)&payload);
    std::__cxx11::string::append((char *)&payload);
  }
  mid = (anonymous_namespace)::message_id;
  pno = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = payload._M_string_length + 0xf3;
  LOCK();
  (anonymous_namespace)::message_id = (anonymous_namespace)::message_id + 1;
  UNLOCK();
  nump = SUB162(auVar1 / ZEXT816(0xf4),0);
  first._M_current = payload._M_dataplus._M_p;
  while( true ) {
    if (nump <= pno) {
      std::__cxx11::string::~string((string *)&payload);
      return;
    }
    pcVar2 = payload._M_dataplus._M_p + (payload._M_string_length - (long)first._M_current);
    if ((long)pcVar2 < 1) break;
    if ((pointer)0xf3 < pcVar2) {
      pcVar2 = (pointer)0xf4;
    }
    __n = (ulong)nump;
    message_type::message_type<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (&local_130,mid,pno,nump,first,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(first._M_current + (long)pcVar2));
    writer::write(wr,(int)&local_130,(void *)(ulong)error_on_timeout,__n);
    pno = pno + 1;
    first._M_current = first._M_current + (long)pcVar2;
  }
  assert_failed("remaining > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/brokerface/send_message.cpp"
                ,0x41);
}

Assistant:

void send_message (writer & wr, bool const error_on_timeout, gsl::czstring const verb,
                           gsl::czstring const path) {
            PSTORE_ASSERT (verb != nullptr);

            auto payload = std::string{verb};
            if (path != nullptr && path[0] != '\0') {
                payload.append (" ");
                payload.append (path);
            }

            // Work out the number of pieces into which we need to break this payload.
            using num_parts_type = std::remove_const<decltype (message_type::num_parts)>::type;
            auto const num_parts =
                static_cast<num_parts_type> ((payload.length () + message_type::payload_chars - 1) /
                                             message_type::payload_chars);

            std::uint32_t const mid = message_id++;

            // Build and send each message.
            auto first = std::begin (payload);

            using difference_type = std::iterator_traits<decltype (first)>::difference_type;
            static_assert (message_type::payload_chars <=
                               static_cast<std::make_unsigned<difference_type>::type> (
                                   std::numeric_limits<difference_type>::max ()),
                           "payload_chars is too large to be represented as "
                           "string::iterator::difference_type");

            for (auto part = num_parts_type{0}; part < num_parts; ++part) {
                auto const remaining = std::distance (first, std::end (payload));
                PSTORE_ASSERT (remaining > 0);

                auto last = first;
                std::advance (last, std::min (remaining, static_cast<difference_type> (
                                                             message_type::payload_chars)));

                wr.write (message_type{mid, part, num_parts, first, last}, error_on_timeout);
                first = last;
            }
        }